

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

ReaderInitializeType __thiscall
duckdb::MultiFileColumnMapper::EvaluateConstantFilters
          (MultiFileColumnMapper *this,ResultColumnMapping *mapping,
          map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
          *remaining_filters)

{
  _Rb_tree_node_base *__k;
  TableFilterSet *pTVar1;
  bool bVar2;
  iterator iVar3;
  type pTVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  Value constant_value;
  Value local_70;
  
  if ((this->global_filters).ptr != (TableFilterSet *)0x0) {
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&this->global_filters);
    pTVar1 = (this->global_filters).ptr;
    p_Var5 = (pTVar1->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pTVar1->filters)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      do {
        __k = p_Var5 + 1;
        iVar3 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)mapping,(key_type *)__k);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
            ._M_cur == (__node_type *)0x0) {
          GetConstantValue(&local_70,this,*(idx_t *)__k);
          pTVar4 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                   operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var5[1]._M_parent);
          bVar2 = EvaluateFilterAgainstConstant(this,pTVar4,&local_70);
          Value::~Value(&local_70);
          if (!bVar2) {
            return SKIP_READING_FILE;
          }
        }
        else {
          pTVar4 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                   operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var5[1]._M_parent);
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>,std::_Select1st<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>>
          ::_M_emplace_unique<unsigned_long_const&,duckdb::TableFilter&>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>,std::_Select1st<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>>
                      *)remaining_filters,(unsigned_long *)__k,pTVar4);
        }
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var6);
    }
  }
  return INITIALIZED;
}

Assistant:

ReaderInitializeType
MultiFileColumnMapper::EvaluateConstantFilters(ResultColumnMapping &mapping,
                                               map<idx_t, reference<TableFilter>> &remaining_filters) {
	if (!global_filters) {
		return ReaderInitializeType::INITIALIZED;
	}
	auto &global_to_local = mapping.global_to_local;
	for (auto &it : global_filters->filters) {
		auto &global_index = it.first;
		auto &global_filter = it.second;

		auto local_it = global_to_local.find(it.first);
		if (local_it != global_to_local.end()) {
			//! File has this column, filter needs to be evaluated later
			remaining_filters.emplace(global_index, *global_filter);
			continue;
		}

		//! FIXME: this does not check for filters against struct fields that are not present in the file
		auto constant_value = GetConstantValue(global_index);
		if (!EvaluateFilterAgainstConstant(*global_filter, constant_value)) {
			return ReaderInitializeType::SKIP_READING_FILE;
		}
	}
	return ReaderInitializeType::INITIALIZED;
}